

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<Resource,_8UL>::~SmallVector(SmallVector<Resource,_8UL> *this)

{
  Resource *__ptr;
  long lVar1;
  size_t i;
  ulong uVar2;
  
  lVar1 = 0x10;
  for (uVar2 = 0; uVar2 < (this->super_VectorView<Resource>).buffer_size; uVar2 = uVar2 + 1) {
    ::std::__cxx11::string::~string
              ((string *)((long)&((this->super_VectorView<Resource>).ptr)->var + lVar1));
    lVar1 = lVar1 + 0x40;
  }
  (this->super_VectorView<Resource>).buffer_size = 0;
  __ptr = (this->super_VectorView<Resource>).ptr;
  if (__ptr != (Resource *)&this->stack_storage) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

~SmallVector()
	{
		clear();
		if (this->ptr != stack_storage.data())
			free(this->ptr);
	}